

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool Memory::Recycler::DoProfileAllocTracker(void)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  
  bVar3 = Js::Configuration::Global[0x5ed5];
  bVar2 = Js::Configuration::Global[0x5ed3];
  cVar1 = Js::Configuration::Global[0x5ed2];
  bVar4 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)Js::Configuration::Global,LeakReportFlag);
  if ((((Js::Configuration::Global[0x2c159] == '\0') && (!bVar4)) &&
      (Js::Configuration::Global[0xe5] == '\0')) &&
     (((cVar1 == '\0' && ((bVar2 & 1) == 0)) && ((bVar3 & 1) == 0)))) {
    bVar4 = MemoryProfiler::DoTrackRecyclerAllocation();
    return bVar4;
  }
  return true;
}

Assistant:

bool
Recycler::DoProfileAllocTracker()
{
    bool doTracker = false;
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    doTracker = Js::Configuration::Global.flags.DumpObjectGraphOnExit
        || Js::Configuration::Global.flags.DumpObjectGraphOnCollect
        || Js::Configuration::Global.flags.DumpObjectGraphOnEnum;
#endif
#ifdef LEAK_REPORT
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        doTracker = true;
    }
#endif
#ifdef CHECK_MEMORY_LEAK
    if (Js::Configuration::Global.flags.CheckMemoryLeak)
    {
        doTracker = true;
    }
#endif
    if (CONFIG_FLAG(KeepRecyclerTrackData))
    {
        doTracker = true;
    }
    return doTracker || MemoryProfiler::DoTrackRecyclerAllocation();
}